

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctpl.h
# Opt level: O1

void __thiscall ctpl::thread_pool::set_thread(thread_pool *this,int i)

{
  pointer psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer puVar2;
  thread *this_01;
  anon_class_32_3_6b467476_for__M_head_impl f;
  anon_class_32_3_6b467476_for__M_head_impl local_38;
  
  psVar1 = (this->flags).
           super__Vector_base<std::shared_ptr<std::atomic<bool>_>,_std::allocator<std::shared_ptr<std::atomic<bool>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_38.flag.super___shared_ptr<std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       psVar1[i].super___shared_ptr<std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = psVar1[i].super___shared_ptr<std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
  }
  puVar2 = (this->threads).
           super__Vector_base<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>,_std::allocator<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_38.this = this;
  local_38.i = i;
  local_38.flag.super___shared_ptr<std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = this_00;
  this_01 = (thread *)operator_new(8);
  std::thread::thread<ctpl::thread_pool::set_thread(int)::_lambda()_1_&,,void>(this_01,&local_38);
  std::__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>::reset
            ((__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_> *)(puVar2 + i),this_01
            );
  if (local_38.flag.super___shared_ptr<std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.flag.super___shared_ptr<std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void set_thread(int i) {
            std::shared_ptr<std::atomic<bool>> flag(this->flags[i]);  // a copy of the shared ptr to the flag
            auto f = [this, i, flag/* a copy of the shared ptr to the flag */]() {
                std::atomic<bool>& _flag = *flag;
                std::function<void(int id)>* _f;
                bool isPop = this->q.pop(_f);
                while (true) {
                    while (isPop) {  // if there is anything in the queue
                        std::unique_ptr<std::function<void(int id)>> func(_f);  // at return, delete the function even if an exception occurred
                        (*_f)(i);

                        if (_flag)
                            return;  // the thread is wanted to stop, return even if the queue is not empty yet
                        else
                            isPop = this->q.pop(_f);
                    }

                    // the queue is empty here, wait for the next command
                    std::unique_lock<std::mutex> lock(this->mutex);
                    ++this->nWaiting;
                    this->cv.wait(lock, [this, &_f, &isPop, &_flag]() { isPop = this->q.pop(_f); return isPop || this->isDone || _flag; });
                    --this->nWaiting;

                    if (!isPop)
                        return;  // if the queue is empty and this->isDone == true or *flag then return
                }
            };
            this->threads[i].reset(new std::thread(f));  // compiler may not support std::make_unique()
        }